

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

bool __thiscall Person::operator==(Person *this,Person *other)

{
  __type _Var1;
  
  _Var1 = std::operator==(&this->name,&other->name);
  return _Var1 && this->age == other->age;
}

Assistant:

bool operator==(const Person & other) const
    {
        return (name == other.name) && (age == other.age);
    }